

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neon_helper.c
# Opt level: O0

uint32_t helper_neon_qshl_u32_aarch64(CPUARMState_conflict *env,uint32_t arg1,uint32_t arg2)

{
  byte bVar1;
  anon_union_4_2_9473010e conv_u_2;
  int8_t tmp;
  anon_union_4_2_9473010e conv_u_1;
  anon_union_4_2_9473010e conv_u;
  neon_u32 vdest;
  neon_u32 vsrc2;
  neon_u32 vsrc1;
  uint32_t res;
  uint32_t arg2_local;
  uint32_t arg1_local;
  CPUARMState_conflict *env_local;
  
  bVar1 = (byte)arg2;
  if ((char)bVar1 < ' ') {
    if ((char)bVar1 < -0x1f) {
      conv_u_1.i = 0;
    }
    else if ((char)bVar1 < '\0') {
      conv_u_1.i = arg1 >> (-bVar1 & 0x1f);
    }
    else {
      conv_u_1.i = arg1 << (bVar1 & 0x1f);
      if (conv_u_1.i >> (bVar1 & 0x1f) != arg1) {
        (env->vfp).qc[0] = 1;
        conv_u_1.i = 0xffffffff;
      }
    }
  }
  else if (arg1 == 0) {
    conv_u_1.i = 0;
  }
  else {
    (env->vfp).qc[0] = 1;
    conv_u_1.i = 0xffffffff;
  }
  return conv_u_1.i;
}

Assistant:

uint64_t HELPER(neon_qshl_u64)(CPUARMState *env, uint64_t val, uint64_t shiftop)
{
    int8_t shift = (int8_t)shiftop;
    if (shift >= 64) {
        if (val) {
            val = ~(uint64_t)0;
            SET_QC();
        }
    } else if (shift <= -64) {
        val = 0;
    } else if (shift < 0) {
        val >>= -shift;
    } else {
        uint64_t tmp = val;
        val <<= shift;
        if ((val >> shift) != tmp) {
            SET_QC();
            val = ~(uint64_t)0;
        }
    }
    return val;
}